

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O1

void __thiscall
pico_tree::kd_tree<Eigen::Matrix<float,3,-1,0,3,-1>,pico_tree::metric_l2_squared,int>::
kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
          (kd_tree<Eigen::Matrix<float,3,_1,0,3,_1>,pico_tree::metric_l2_squared,int> *this,
          space_type *space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
          splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
          splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule)

{
  undefined1 local_11;
  
  *(float **)this =
       (space->super_PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>).m_storage.m_data;
  *(Index *)(this + 8) =
       (space->super_PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>).m_storage.m_cols;
  (space->super_PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>).m_storage.m_data =
       (float *)0x0;
  (space->super_PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>).m_storage.m_cols = 0;
  internal::
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
  ::operator()((kd_tree_data_type *)(this + 0x18),&local_11,
               (space_wrapper<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>)this,stop_condition,
               start_bounds,rule);
  return;
}

Assistant:

kd_tree(
      space_type space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds = Bounds_{},
      splitter_rule_t<Rule_> const& rule = Rule_{})
      : space_(std::move(space)),
        metric_(),
        data_(
            internal::build_kd_tree<kd_tree_data_type, dim>()(
                space_wrapper_type(space_),
                stop_condition,
                start_bounds,
                rule)) {}